

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

void __thiscall
cppqc::StatelessGenerator<std::vector<int,std::allocator<int>>>::
StatelessGenerator<cppqc::detail::ListOfStatelessGenerator<int>>
          (StatelessGenerator<std::vector<int,_std::allocator<int>_>_> *this,
          ListOfStatelessGenerator<int> *gm)

{
  unique_ptr<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  StatelessGenModel<cppqc::detail::ListOfStatelessGenerator<int>_> *in_RSI;
  ListOfStatelessGenerator<int> *in_RDI;
  ListOfStatelessGenerator<int> *in_stack_ffffffffffffffe8;
  
  this_00 = (unique_ptr<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
             *)operator_new(0x10);
  detail::ListOfStatelessGenerator<int>::ListOfStatelessGenerator
            ((ListOfStatelessGenerator<int> *)this_00,in_RDI);
  StatelessGenerator<std::vector<int,_std::allocator<int>_>_>::
  StatelessGenModel<cppqc::detail::ListOfStatelessGenerator<int>_>::StatelessGenModel
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<cppqc::detail::StatelessGenConcept<std::vector<int,std::allocator<int>>>,std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,std::allocator<int>>>>>
  ::
  unique_ptr<std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,std::allocator<int>>>>,void>
            (this_00,(pointer)in_RDI);
  detail::ListOfStatelessGenerator<int>::~ListOfStatelessGenerator
            ((ListOfStatelessGenerator<int> *)0x1239fa);
  return;
}

Assistant:

StatelessGenerator(const StatelessGeneratorModel& gm)
      : m_gen{new StatelessGenModel<StatelessGeneratorModel>(gm)} {}